

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O1

int __thiscall booster::streambuf::underflow(streambuf *this)

{
  pointer pcVar1;
  pointer pcVar2;
  char *pcVar3;
  int iVar4;
  io_device *piVar5;
  undefined4 extraout_var;
  
  pcVar1 = (this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = (this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pcVar1 == pcVar2) || (this->buffer_size_ < (ulong)((long)pcVar2 - (long)pcVar1))) {
    std::vector<char,_std::allocator<char>_>::resize(&this->buffer_in_,this->buffer_size_);
  }
  pcVar3 = (this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = device(this);
  iVar4 = (**piVar5->_vptr_io_device)
                    (piVar5,pcVar3,
                     (long)(this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
  *(char **)&this->field_0x8 = pcVar3;
  *(char **)&this->field_0x10 = pcVar3;
  *(char **)&this->field_0x18 = pcVar3 + CONCAT44(extraout_var,iVar4);
  return -(uint)(CONCAT44(extraout_var,iVar4) == 0) | (int)*pcVar3;
}

Assistant:

int streambuf::underflow()
	{
		if(buffer_in_.empty() || buffer_in_.size() > buffer_size_)
			buffer_in_.resize(buffer_size_);
		char *buf_ptr = &buffer_in_.front();
		std::streamsize n=device().read(buf_ptr,buffer_in_.size());
		setg(buf_ptr,buf_ptr,buf_ptr+n);
		if(n==0)
			return EOF;
		return *buf_ptr;
	}